

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

Json * Json::parseFile(Json *__return_storage_ptr__,string *path_to_file)

{
  istream *piVar1;
  string result;
  string s;
  ifstream file_with_json;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result," ",(allocator<char> *)&file_with_json);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s," ",(allocator<char> *)&file_with_json);
  std::ifstream::ifstream(&file_with_json,(string *)path_to_file,_S_in);
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file_with_json,(string *)&s);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::append((string *)&result);
  }
  Json(__return_storage_ptr__,&result);
  std::ifstream::~ifstream(&file_with_json);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

Json Json::parseFile(const string& path_to_file) {
	string result = " ";
	string s = " ";
	ifstream file_with_json(path_to_file);
	while (getline(file_with_json,s)) {
		result += s;
	}
	return parse(result);
}